

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptSubpassInputType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  HlslParseContext *pHVar8;
  _func_int **pp_Var9;
  TSampler sampler;
  TType subpassType;
  TIntermNode *nodeList;
  TSampler local_14c;
  TType local_148;
  TType local_b0;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (EVar2 == EHTokSubpassInput) {
    uVar7 = 0x1f080700;
  }
  else {
    if (EVar2 != EHTokSubpassInputMS) {
      return false;
    }
    uVar7 = 0x1f0c0700;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType(&local_148,EbtFloat,EvqUniform,4,0,0,false);
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar1) {
    local_b0._vptr_TType = (_func_int **)0x0;
    bVar1 = acceptType(this,&local_148,(TIntermNode **)&local_b0);
    if (bVar1) {
      if (((byte)local_148._8_1_ < 0x10) && ((0x8302U >> ((byte)local_148._8_1_ & 0x1f) & 1) != 0))
      {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) goto LAB_0042ace0;
        pHVar8 = this->parseContext;
        pp_Var9 = (pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar6 = "Expected";
        pcVar5 = "right angle bracket";
      }
      else {
        pHVar8 = this->parseContext;
        pp_Var9 = (pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar6 = "Unimplemented";
        pcVar5 = "basic type in subpass input";
      }
    }
    else {
      pHVar8 = this->parseContext;
      pp_Var9 = (pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar6 = "Expected";
      pcVar5 = "scalar or vector type";
    }
    bVar1 = false;
    (*pp_Var9[0x2d])(pHVar8,&(this->super_HlslTokenStream).token,pcVar6,pcVar5,"");
  }
  else {
LAB_0042ace0:
    uVar4 = (uint)(byte)local_148._8_1_;
    if ((byte)local_148._8_1_ - 0xf < 2) {
      iVar3 = (*local_148._vptr_TType[0x25])();
      if ((char)iVar3 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      uVar4 = (*(((local_148.field_13.structure)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
      uVar4 = uVar4 & 0xff;
    }
    local_14c = (TSampler)(uVar7 | uVar4);
    bVar1 = HlslParseContext::setTextureReturnType
                      (this->parseContext,&local_14c,&local_148,
                       &(this->super_HlslTokenStream).token.loc);
    if (bVar1) {
      local_b0._vptr_TType = (_func_int **)&PTR__TType_00af5e70;
      local_b0._8_4_ = 0x10e;
      local_b0.arraySizes = (TArraySizes *)0x0;
      local_b0.field_13.structure = (TTypeList *)0x0;
      local_b0.fieldName = (TString *)0x0;
      local_b0.typeName = (TString *)0x0;
      local_b0.sampler = local_14c;
      local_b0.typeParameters = (TTypeParameters *)0x0;
      local_b0.spirvType = (TSpirvType *)0x0;
      local_b0.qualifier.semanticName = (char *)0x0;
      local_b0.qualifier._16_1_ = 0;
      local_b0.qualifier.layoutOffset = -1;
      local_b0.qualifier.layoutAlign = -1;
      local_b0.qualifier.layoutPushConstant = false;
      local_b0.qualifier.layoutBufferReference = false;
      local_b0.qualifier.layoutPassthrough = false;
      local_b0.qualifier.layoutViewportRelative = false;
      local_b0.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
      local_b0.qualifier.layoutBindlessSampler = false;
      local_b0.qualifier.layoutBindlessImage = false;
      local_b0.qualifier.layoutShaderRecord = false;
      local_b0.qualifier.layoutFullQuads = false;
      local_b0.qualifier.layoutQuadDeriv = false;
      local_b0.qualifier.layoutHitObjectShaderRecordNV = false;
      local_b0.qualifier._44_1_ = 0;
      local_b0.qualifier._28_8_ = 0xffffffff001fcfff;
      local_b0.qualifier._36_8_ = 0xffffffffffffffff;
      local_b0.qualifier.spirvStorageClass = -1;
      local_b0.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
      local_b0.qualifier._8_8_ = 5;
      TType::shallowCopy(type,&local_b0);
    }
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptSubpassInputType(TType& type)
{
    // read subpass type
    const EHlslTokenClass subpassInputType = peek();

    bool multisample;

    switch (subpassInputType) {
    case EHTokSubpassInput:   multisample = false; break;
    case EHTokSubpassInputMS: multisample = true;  break;
    default:
        return false;  // not a subpass input declaration
    }

    advanceToken();  // consume the sampler type keyword

    TType subpassType(EbtFloat, EvqUniform, 4); // default type is float4

    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(subpassType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = subpassType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in subpass input");
            return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    }

    const TBasicType subpassBasicType = subpassType.isStruct() ? (*subpassType.getStruct())[0].type->getBasicType()
        : subpassType.getBasicType();

    TSampler sampler;
    sampler.setSubpass(subpassBasicType, multisample);

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, subpassType, token.loc))
        return false;

    type.shallowCopy(TType(sampler, EvqUniform));

    return true;
}